

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double deranged_pdf(int x,int a)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  
  dVar7 = 0.0;
  if (x <= a && -1 < x) {
    iVar1 = i4_choose(a,x);
    uVar2 = a - x;
    if ((int)uVar2 < 0) {
      iVar4 = 0;
    }
    else if (uVar2 < 3) {
      iVar4 = *(int *)(&DAT_0021f5b0 + (ulong)uVar2 * 4);
    }
    else {
      uVar5 = 2;
      iVar4 = 1;
      iVar6 = 0;
      do {
        iVar3 = iVar4;
        iVar4 = (iVar6 + iVar3) * uVar5;
        uVar5 = uVar5 + 1;
        iVar6 = iVar3;
      } while (uVar2 != uVar5);
    }
    dVar7 = r8_factorial(a);
    dVar7 = (double)(iVar4 * iVar1) / dVar7;
  }
  return dVar7;
}

Assistant:

double deranged_pdf ( int x, int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_PDF evaluates the Deranged PDF.
//
//  Discussion:
//
//    PDF(A;X) is the probability that exactly X items will occur in
//    their proper place after a random permutation of A items.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the number of items in their correct places.
//    0 <= X <= A.
//
//    Input, int A, the total number of items.
//    1 <= A.
//
//    Output, double PDF, the value of the PDF.
//
{
  int cnk;
  int dnmk;
  double pdf;

  if ( x < 0 || a < x )
  {
    pdf = 0.0;
  }
  else
  {
    cnk = i4_choose ( a, x );
    dnmk = deranged_enum ( a - x );
    pdf = static_cast< double >( cnk * dnmk ) / r8_factorial ( a );
  }

  return pdf;
}